

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_literal
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel,bool explicit_key,bool explicit_indentation)

{
  csubstr sp;
  csubstr sp_00;
  ro_substr chars;
  bool bVar1;
  error_flags eVar2;
  long lVar3;
  size_t sVar4;
  long in_RCX;
  ulong in_RDX;
  byte in_R8B;
  byte in_R9B;
  size_t lv_2;
  size_t i_1;
  size_t lv_1;
  size_t lv;
  csubstr since_pos;
  size_t i;
  size_t pos;
  size_t numnewlines_at_end;
  csubstr trimmed;
  undefined4 in_stack_fffffffffffffde8;
  error_flags in_stack_fffffffffffffdec;
  char cVar5;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  error_flags in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  error_flags in_stack_fffffffffffffe04;
  char *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  error_flags in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe18;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pWVar6;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  ulong local_198;
  ulong local_190;
  basic_substring<const_char> *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  ulong uVar7;
  ulong local_160;
  char *local_148;
  char *local_140;
  ulong local_128;
  basic_substring<char_const> local_120 [16];
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  byte local_fa;
  byte local_f9;
  long local_f8;
  undefined1 local_e8 [8];
  ulong local_e0;
  char *local_d8;
  undefined4 local_d0;
  char *local_c8;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c0;
  char *local_a8;
  undefined4 local_a0;
  ulong local_98;
  undefined1 *local_90;
  char *local_78;
  undefined4 local_70;
  char *local_68;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  char *local_58;
  undefined4 local_50;
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  char *local_28;
  char *local_20;
  WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  
  cVar5 = (char)((ulong)in_stack_fffffffffffffe18 >> 0x38);
  local_f9 = in_R8B & 1;
  local_fa = in_R9B & 1;
  local_f8 = in_RCX;
  local_e0 = in_RDX;
  if ((in_R8B & 1) != 0) {
    WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
              (in_stack_fffffffffffffdf0,
               (char (*) [3])CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  basic_substring<char_const>::basic_substring<3ul>(local_120,(char (*) [3])0x35a26e);
  chars.len = in_stack_fffffffffffffe88;
  chars.str = in_stack_fffffffffffffe80;
  local_110 = (WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               )basic_substring<const_char>::trimr(in_stack_fffffffffffffe78,chars);
  lVar3 = local_e0 - local_110.m_pos;
  local_90 = local_e8;
  local_98 = local_110.m_pos;
  if (local_e0 < local_110.m_pos) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    local_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_a0 = 0x1533;
    handle_error(0x345f1b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring
            ((basic_substring<const_char> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
             ,CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  sVar4 = basic_substring<const_char>::count
                    ((basic_substring<const_char> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),cVar5,
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  local_128 = lVar3 - sVar4;
  if ((local_fa & 1) == 0) {
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(in_stack_fffffffffffffdf0,(char)(in_stack_fffffffffffffdec >> 0x18));
  }
  else {
    WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
              (in_stack_fffffffffffffdf0,
               (char (*) [3])CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  if ((local_128 < 2) && ((local_110.m_pos != 0 || (local_e0 == 0)))) {
    if (local_128 == 1) {
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffdf0,(char)(in_stack_fffffffffffffdec >> 0x18));
    }
    else {
      WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                (in_stack_fffffffffffffdf0,
                 (char (*) [3])CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    }
  }
  else {
    WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
              (in_stack_fffffffffffffdf0,
               (char (*) [3])CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  }
  if (local_110.m_pos != 0) {
    local_140 = (char *)0x0;
    for (local_148 = (char *)0x0; local_148 < local_110.m_pos; local_148 = local_148 + 1) {
      local_60 = &local_110;
      local_68 = local_148;
      if (local_110.m_pos <= local_148) {
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_78 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_70 = 0x14c3;
        handle_error(0x345f1b,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (local_110.m_stream[(long)local_68] ==
          (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0xa) {
        local_28 = local_148 + 1;
        pWVar6 = &local_110;
        local_20 = local_140;
        local_18 = pWVar6;
        if (local_110.m_pos < local_140) {
          in_stack_fffffffffffffe14 = get_error_flags();
          if ((in_stack_fffffffffffffe14 & 1) != 0) {
            bVar1 = is_debugger_attached();
            in_stack_fffffffffffffe10 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe10);
            if (bVar1) {
              trap_instruction();
            }
          }
          local_38 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_30 = 0x1544;
          handle_error(0x345f1b,(char *)0x1544,"check failed: %s","first >= 0 && first <= len");
        }
        in_stack_fffffffffffffe08 = local_28;
        if (local_28 == (char *)0xffffffffffffffff) {
          in_stack_fffffffffffffe08 = (char *)pWVar6->m_pos;
        }
        local_28 = in_stack_fffffffffffffe08;
        if (in_stack_fffffffffffffe08 < local_20) {
          in_stack_fffffffffffffe04 = get_error_flags();
          if ((in_stack_fffffffffffffe04 & 1) != 0) {
            bVar1 = is_debugger_attached();
            in_stack_fffffffffffffe00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe00);
            if (bVar1) {
              trap_instruction();
            }
          }
          local_48 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_40 = 0x1546;
          handle_error(0x345f1b,(char *)0x1546,"check failed: %s","first <= last");
        }
        if ((char *)pWVar6->m_pos < local_28) {
          in_stack_fffffffffffffdfc = get_error_flags();
          if ((in_stack_fffffffffffffdfc & 1) != 0) {
            bVar1 = is_debugger_attached();
            in_stack_fffffffffffffdf8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdf8);
            if (bVar1) {
              trap_instruction();
            }
          }
          local_58 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_50 = 0x1547;
          handle_error(0x345f1b,(char *)0x1547,"check failed: %s","last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)
                   CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe08,
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        for (local_160 = 0; local_160 < local_f8 + 1U; local_160 = local_160 + 1) {
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(in_stack_fffffffffffffdf0,(char)(in_stack_fffffffffffffdec >> 0x18));
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(in_stack_fffffffffffffdf0,(char)(in_stack_fffffffffffffdec >> 0x18));
        }
        sp.str._4_4_ = in_stack_fffffffffffffe04;
        sp.str._0_4_ = in_stack_fffffffffffffe00;
        sp.len = (size_t)in_stack_fffffffffffffe08;
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),sp);
        local_140 = local_148 + 1;
      }
    }
    if (local_140 < local_110.m_pos) {
      for (uVar7 = 0; uVar7 < local_f8 + 1U; uVar7 = uVar7 + 1) {
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffdf0,(char)(in_stack_fffffffffffffdec >> 0x18));
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(in_stack_fffffffffffffdf0,(char)(in_stack_fffffffffffffdec >> 0x18));
      }
      in_stack_fffffffffffffdf0 = &local_110;
      local_c8 = local_140;
      local_c0 = in_stack_fffffffffffffdf0;
      if (local_110.m_pos < local_140) {
        in_stack_fffffffffffffdec = get_error_flags();
        if (((in_stack_fffffffffffffdec & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        local_d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_d0 = 0x1533;
        handle_error(0x345f1b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08,
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      sp_00.str._4_4_ = in_stack_fffffffffffffe04;
      sp_00.str._0_4_ = in_stack_fffffffffffffe00;
      sp_00.len = (size_t)in_stack_fffffffffffffe08;
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write((WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),sp_00);
    }
    if (local_128 != 0) {
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffdf0,(char)(in_stack_fffffffffffffdec >> 0x18));
      local_128 = local_128 - 1;
    }
  }
  for (local_190 = 0; local_190 < local_128; local_190 = local_190 + 1) {
    for (local_198 = 0; cVar5 = (char)(in_stack_fffffffffffffdec >> 0x18), local_198 < local_f8 + 1U
        ; local_198 = local_198 + 1) {
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffdf0,cVar5);
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffdf0,(char)(in_stack_fffffffffffffdec >> 0x18));
    }
    if ((local_190 + 1 < local_128) || ((local_f9 & 1) != 0)) {
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(in_stack_fffffffffffffdf0,cVar5);
    }
  }
  if (((local_f9 & 1) != 0) && (local_128 == 0)) {
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(in_stack_fffffffffffffdf0,(char)(in_stack_fffffffffffffdec >> 0x18));
  }
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_literal(csubstr s, size_t ilevel, bool explicit_key, bool explicit_indentation)
{
    if(explicit_key)
        this->Writer::_do_write("? ");
    csubstr trimmed = s.trimr("\n\r");
    size_t numnewlines_at_end = s.len - trimmed.len - s.sub(trimmed.len).count('\r');
    //
    if(!explicit_indentation)
        this->Writer::_do_write('|');
    else
        this->Writer::_do_write("|2");
    //
    if(numnewlines_at_end > 1 || (trimmed.len == 0 && s.len > 0)/*only newlines*/)
        this->Writer::_do_write("+\n");
    else if(numnewlines_at_end == 1)
        this->Writer::_do_write('\n');
    else
        this->Writer::_do_write("-\n");
    //
    if(trimmed.len)
    {
        size_t pos = 0; // tracks the last character that was already written
        for(size_t i = 0; i < trimmed.len; ++i)
        {
            if(trimmed[i] != '\n')
                continue;
            // write everything up to this point
            csubstr since_pos = trimmed.range(pos, i+1); // include the newline
            _rymlindent_nextline()
            this->Writer::_do_write(since_pos);
            pos = i+1; // already written
        }
        if(pos < trimmed.len)
        {
            _rymlindent_nextline()
            this->Writer::_do_write(trimmed.sub(pos));
        }
        if(numnewlines_at_end)
        {
            this->Writer::_do_write('\n');
            --numnewlines_at_end;
        }
    }
    for(size_t i = 0; i < numnewlines_at_end; ++i)
    {
        _rymlindent_nextline()
        if(i+1 < numnewlines_at_end || explicit_key)
            this->Writer::_do_write('\n');
    }
    if(explicit_key && !numnewlines_at_end)
        this->Writer::_do_write('\n');
}